

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
* mocker::nasm::getDefinedRegs
            (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *__return_storage_ptr__,shared_ptr<mocker::nasm::Inst> *inst)

{
  allocator<std::shared_ptr<mocker::nasm::Register>_> *paVar1;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_00;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_01;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_02;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_03;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_04;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_05;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_06;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_07;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_08;
  bool bVar2;
  bool bVar3;
  element_type *this;
  element_type *this_00;
  element_type *this_01;
  element_type *this_02;
  element_type *this_03;
  shared_ptr<mocker::nasm::Register> *psVar4;
  shared_ptr<mocker::nasm::Register> *local_7b8;
  shared_ptr<mocker::nasm::Register> *local_760;
  shared_ptr<mocker::nasm::Register> *local_700;
  shared_ptr<mocker::nasm::Register> *local_6a8;
  shared_ptr<mocker::nasm::Register> *local_648;
  shared_ptr<mocker::nasm::Register> *local_5f0;
  shared_ptr<mocker::nasm::Addr> *local_510;
  shared_ptr<mocker::nasm::Register> *local_4c0;
  shared_ptr<mocker::nasm::Register> *local_468;
  shared_ptr<mocker::nasm::Register> *local_420;
  bool local_3ea;
  allocator<std::shared_ptr<mocker::nasm::Register>_> local_3e9;
  undefined1 *local_3e8;
  shared_ptr<mocker::nasm::Register> local_3e0;
  shared_ptr<mocker::nasm::Register> *local_3d0;
  size_type local_3c8;
  undefined1 local_3c0 [8];
  shared_ptr<mocker::nasm::Cqo> p_9;
  undefined1 local_3a0 [32];
  shared_ptr<mocker::nasm::Register> local_380;
  undefined1 local_370 [8];
  shared_ptr<mocker::nasm::IDiv> p_8;
  shared_ptr<mocker::nasm::Register> local_350;
  shared_ptr<mocker::nasm::Register> *local_340;
  size_type local_338;
  undefined1 local_330 [8];
  shared_ptr<mocker::nasm::Set> p_7;
  undefined1 local_310 [32];
  shared_ptr<mocker::nasm::Register> local_2f0;
  undefined1 local_2e0 [8];
  shared_ptr<mocker::nasm::Leave> p_6;
  shared_ptr<mocker::nasm::Register> local_2c0;
  shared_ptr<mocker::nasm::Register> *local_2b0;
  size_type local_2a8;
  undefined1 local_2a0 [8];
  shared_ptr<mocker::nasm::Pop> p_5;
  undefined1 local_280 [32];
  shared_ptr<mocker::nasm::Register> local_260;
  shared_ptr<mocker::nasm::Register> local_250;
  shared_ptr<mocker::nasm::Register> local_240;
  shared_ptr<mocker::nasm::Register> local_230;
  shared_ptr<mocker::nasm::Register> local_220;
  shared_ptr<mocker::nasm::Register> local_210;
  shared_ptr<mocker::nasm::Register> local_200;
  shared_ptr<mocker::nasm::Register> local_1f0;
  shared_ptr<mocker::nasm::Register> local_1e0;
  undefined1 local_1d0 [8];
  shared_ptr<mocker::nasm::Call> p_4;
  shared_ptr<mocker::nasm::Addr> local_1b0;
  shared_ptr<mocker::nasm::Addr> local_1a0;
  undefined1 local_190 [8];
  shared_ptr<mocker::nasm::BinaryInst> p_3;
  shared_ptr<mocker::nasm::Register> local_170;
  shared_ptr<mocker::nasm::Register> *local_160;
  size_type local_158;
  undefined1 local_150 [8];
  shared_ptr<mocker::nasm::UnaryInst> p_2;
  shared_ptr<mocker::nasm::Register> local_130;
  shared_ptr<mocker::nasm::Register> *local_120;
  size_type local_118;
  undefined1 local_110 [8];
  shared_ptr<mocker::nasm::Lea> p_1;
  shared_ptr<mocker::nasm::Register> local_f8;
  shared_ptr<mocker::nasm::Register> *local_e8;
  size_type local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  shared_ptr<mocker::nasm::Register> reg;
  shared_ptr<mocker::nasm::Mov> p;
  shared_ptr<mocker::nasm::Cmp> local_a0;
  byte local_89;
  shared_ptr<mocker::nasm::CJump> local_88;
  byte local_71;
  shared_ptr<mocker::nasm::Inst> local_70;
  byte local_59;
  shared_ptr<mocker::nasm::Inst> local_58;
  byte local_45;
  shared_ptr<mocker::nasm::Inst> local_38;
  shared_ptr<mocker::nasm::Empty> local_28;
  shared_ptr<mocker::nasm::Inst> *local_18;
  shared_ptr<mocker::nasm::Inst> *inst_local;
  
  local_18 = inst;
  inst_local = (shared_ptr<mocker::nasm::Inst> *)__return_storage_ptr__;
  dyc<mocker::nasm::Empty,std::shared_ptr<mocker::nasm::Inst>const&>
            ((shared_ptr<mocker::nasm::Inst> *)&local_28);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_28);
  local_45 = 0;
  local_59 = 0;
  local_71 = 0;
  local_89 = 0;
  bVar3 = false;
  local_3ea = true;
  if (!bVar2) {
    dyc<mocker::nasm::Ret,std::shared_ptr<mocker::nasm::Inst>const&>(&local_38);
    local_45 = 1;
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_38);
    local_3ea = true;
    if (!bVar2) {
      dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>(&local_58);
      local_59 = 1;
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_58);
      local_3ea = true;
      if (!bVar2) {
        dyc<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Inst>const&>(&local_70);
        local_71 = 1;
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_70);
        local_3ea = true;
        if (!bVar2) {
          dyc<mocker::nasm::CJump,std::shared_ptr<mocker::nasm::Inst>const&>
                    ((shared_ptr<mocker::nasm::Inst> *)&local_88);
          local_89 = 1;
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_88);
          local_3ea = true;
          if (!bVar2) {
            dyc<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Inst>const&>
                      ((shared_ptr<mocker::nasm::Inst> *)&local_a0);
            bVar3 = true;
            local_3ea = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_a0);
          }
        }
      }
    }
  }
  if (bVar3) {
    std::shared_ptr<mocker::nasm::Cmp>::~shared_ptr(&local_a0);
  }
  if ((local_89 & 1) != 0) {
    std::shared_ptr<mocker::nasm::CJump>::~shared_ptr(&local_88);
  }
  if ((local_71 & 1) != 0) {
    std::shared_ptr<mocker::nasm::Jmp>::~shared_ptr((shared_ptr<mocker::nasm::Jmp> *)&local_70);
  }
  if ((local_59 & 1) != 0) {
    std::shared_ptr<mocker::nasm::Push>::~shared_ptr((shared_ptr<mocker::nasm::Push> *)&local_58);
  }
  if ((local_45 & 1) != 0) {
    std::shared_ptr<mocker::nasm::Ret>::~shared_ptr((shared_ptr<mocker::nasm::Ret> *)&local_38);
  }
  std::shared_ptr<mocker::nasm::Empty>::~shared_ptr(&local_28);
  if (local_3ea == false) {
    dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>
              ((shared_ptr<mocker::nasm::Inst> *)
               &reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar3 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar3) {
      std::__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )&reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
      Mov::getDest((Mov *)local_d8);
      dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const>
                ((shared_ptr<mocker::nasm::Addr> *)local_c8);
      std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_d8);
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_c8);
      if (bVar3) {
        std::shared_ptr<mocker::nasm::Register>::shared_ptr
                  (&local_f8,(shared_ptr<mocker::nasm::Register> *)local_c8);
        local_e0 = 1;
        paVar1 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                 ((long)&p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7);
        local_e8 = &local_f8;
        std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(paVar1);
        __l_08._M_len = local_e0;
        __l_08._M_array = local_e8;
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::vector(__return_storage_ptr__,__l_08,paVar1);
        std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                  ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                   ((long)&p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        local_420 = (shared_ptr<mocker::nasm::Register> *)&local_e8;
        do {
          local_420 = local_420 + -1;
          std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_420);
        } while (local_420 != &local_f8);
        p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 1;
      }
      else {
        p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
      }
      std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                ((shared_ptr<mocker::nasm::Register> *)local_c8);
      if ((int)p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi == 0) {
        memset(__return_storage_ptr__,0,0x18);
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::vector(__return_storage_ptr__);
        p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 1;
      }
    }
    else {
      p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
    }
    std::shared_ptr<mocker::nasm::Mov>::~shared_ptr
              ((shared_ptr<mocker::nasm::Mov> *)
               &reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if ((int)p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == 0) {
      dyc<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Inst>const&>
                ((shared_ptr<mocker::nasm::Inst> *)local_110);
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_110);
      if (bVar3) {
        this = std::__shared_ptr_access<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_110);
        psVar4 = Lea::getDest(this);
        std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_130,psVar4);
        local_118 = 1;
        paVar1 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                 ((long)&p_2.super___shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7);
        local_120 = &local_130;
        std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(paVar1);
        __l_07._M_len = local_118;
        __l_07._M_array = local_120;
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::vector(__return_storage_ptr__,__l_07,paVar1);
        std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                  ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                   ((long)&p_2.
                           super___shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        local_468 = (shared_ptr<mocker::nasm::Register> *)&local_120;
        do {
          local_468 = local_468 + -1;
          std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_468);
        } while (local_468 != &local_130);
        p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 1;
      }
      else {
        p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
      }
      std::shared_ptr<mocker::nasm::Lea>::~shared_ptr((shared_ptr<mocker::nasm::Lea> *)local_110);
      if ((int)p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi == 0) {
        dyc<mocker::nasm::UnaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                  ((shared_ptr<mocker::nasm::Inst> *)local_150);
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_150);
        if (bVar3) {
          this_00 = std::
                    __shared_ptr_access<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_150);
          psVar4 = UnaryInst::getReg(this_00);
          std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_170,psVar4);
          local_158 = 1;
          paVar1 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                   ((long)&p_3.
                           super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7);
          local_160 = &local_170;
          std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(paVar1);
          __l_06._M_len = local_158;
          __l_06._M_array = local_160;
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::vector(__return_storage_ptr__,__l_06,paVar1);
          std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                    ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                     ((long)&p_3.
                             super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          local_4c0 = (shared_ptr<mocker::nasm::Register> *)&local_160;
          do {
            local_4c0 = local_4c0 + -1;
            std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_4c0);
          } while (local_4c0 != &local_170);
          p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 1;
        }
        else {
          p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
        }
        std::shared_ptr<mocker::nasm::UnaryInst>::~shared_ptr
                  ((shared_ptr<mocker::nasm::UnaryInst> *)local_150);
        if ((int)p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi == 0) {
          dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                    ((shared_ptr<mocker::nasm::Inst> *)local_190);
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_190);
          if (bVar3) {
            this_01 = std::
                      __shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_190);
            BinaryInst::getLhs(this_01);
            dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const&>(&local_1b0);
            local_1a0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)&local_1b0;
            local_1a0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
            paVar1 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                     ((long)&p_4.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7);
            std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(paVar1);
            __l_05._M_len =
                 (size_type)
                 local_1a0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            __l_05._M_array =
                 (iterator)
                 local_1a0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            ;
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::vector(__return_storage_ptr__,__l_05,paVar1);
            std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                      ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                       ((long)&p_4.
                               super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 7));
            local_510 = &local_1a0;
            do {
              local_510 = local_510 + -1;
              std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                        ((shared_ptr<mocker::nasm::Register> *)local_510);
            } while (local_510 != &local_1b0);
            p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _0_4_ = 1;
          }
          else {
            p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _0_4_ = 0;
          }
          std::shared_ptr<mocker::nasm::BinaryInst>::~shared_ptr
                    ((shared_ptr<mocker::nasm::BinaryInst> *)local_190);
          if ((int)p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi == 0) {
            dyc<mocker::nasm::Call,std::shared_ptr<mocker::nasm::Inst>const&>
                      ((shared_ptr<mocker::nasm::Inst> *)local_1d0);
            bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1d0);
            if (bVar3) {
              psVar4 = rax();
              std::shared_ptr<mocker::nasm::Register>::shared_ptr
                        ((shared_ptr<mocker::nasm::Register> *)local_280,psVar4);
              psVar4 = rcx();
              std::shared_ptr<mocker::nasm::Register>::shared_ptr
                        ((shared_ptr<mocker::nasm::Register> *)(local_280 + 0x10),psVar4);
              psVar4 = rdx();
              std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_260,psVar4);
              psVar4 = rsp();
              std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_250,psVar4);
              psVar4 = rsi();
              std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_240,psVar4);
              psVar4 = rdi();
              std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_230,psVar4);
              psVar4 = r8();
              std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_220,psVar4);
              psVar4 = r9();
              std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_210,psVar4);
              psVar4 = r10();
              std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_200,psVar4);
              psVar4 = r11();
              std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_1f0,psVar4);
              local_1e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)local_280;
              local_1e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa;
              paVar1 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                       ((long)&p_5.super___shared_ptr<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 7);
              std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(paVar1);
              __l_04._M_len =
                   (size_type)
                   local_1e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              __l_04._M_array =
                   (iterator)
                   local_1e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::vector(__return_storage_ptr__,__l_04,paVar1);
              std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                        ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                         ((long)&p_5.
                                 super___shared_ptr<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 7));
              local_5f0 = &local_1e0;
              do {
                local_5f0 = local_5f0 + -1;
                std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_5f0);
              } while (local_5f0 != (shared_ptr<mocker::nasm::Register> *)local_280);
              p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._0_4_ = 1;
            }
            else {
              p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._0_4_ = 0;
            }
            std::shared_ptr<mocker::nasm::Call>::~shared_ptr
                      ((shared_ptr<mocker::nasm::Call> *)local_1d0);
            if ((int)p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi == 0) {
              dyc<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Inst>const&>
                        ((shared_ptr<mocker::nasm::Inst> *)local_2a0);
              bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2a0);
              if (bVar3) {
                this_02 = std::
                          __shared_ptr_access<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_2a0);
                psVar4 = Pop::getReg(this_02);
                std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_2c0,psVar4);
                local_2a8 = 1;
                paVar1 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                         ((long)&p_6.
                                 super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7);
                local_2b0 = &local_2c0;
                std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(paVar1);
                __l_03._M_len = local_2a8;
                __l_03._M_array = local_2b0;
                std::
                vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ::vector(__return_storage_ptr__,__l_03,paVar1);
                std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                          ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                           ((long)&p_6.
                                   super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi + 7));
                local_648 = (shared_ptr<mocker::nasm::Register> *)&local_2b0;
                do {
                  local_648 = local_648 + -1;
                  std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_648);
                } while (local_648 != &local_2c0);
                p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._0_4_ = 1;
              }
              else {
                p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._0_4_ = 0;
              }
              std::shared_ptr<mocker::nasm::Pop>::~shared_ptr
                        ((shared_ptr<mocker::nasm::Pop> *)local_2a0);
              if ((int)p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi == 0) {
                dyc<mocker::nasm::Leave,std::shared_ptr<mocker::nasm::Inst>const&>
                          ((shared_ptr<mocker::nasm::Inst> *)local_2e0);
                bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2e0);
                if (bVar3) {
                  psVar4 = rsp();
                  std::shared_ptr<mocker::nasm::Register>::shared_ptr
                            ((shared_ptr<mocker::nasm::Register> *)local_310,psVar4);
                  psVar4 = rbp();
                  std::shared_ptr<mocker::nasm::Register>::shared_ptr
                            ((shared_ptr<mocker::nasm::Register> *)(local_310 + 0x10),psVar4);
                  local_2f0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)local_310;
                  local_2f0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
                  paVar1 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                           ((long)&p_7.
                                   super___shared_ptr<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi + 7);
                  std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(paVar1);
                  __l_02._M_len =
                       (size_type)
                       local_2f0.
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
                  __l_02._M_array =
                       (iterator)
                       local_2f0.
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ;
                  std::
                  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ::vector(__return_storage_ptr__,__l_02,paVar1);
                  std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                            ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                             ((long)&p_7.
                                     super___shared_ptr<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi + 7));
                  local_6a8 = &local_2f0;
                  do {
                    local_6a8 = local_6a8 + -1;
                    std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_6a8);
                  } while (local_6a8 != (shared_ptr<mocker::nasm::Register> *)local_310);
                  p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._0_4_ = 1;
                }
                else {
                  p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._0_4_ = 0;
                }
                std::shared_ptr<mocker::nasm::Leave>::~shared_ptr
                          ((shared_ptr<mocker::nasm::Leave> *)local_2e0);
                if ((int)p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi == 0) {
                  dyc<mocker::nasm::Set,std::shared_ptr<mocker::nasm::Inst>const&>
                            ((shared_ptr<mocker::nasm::Inst> *)local_330);
                  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_330);
                  if (bVar3) {
                    this_03 = std::
                              __shared_ptr_access<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)local_330);
                    psVar4 = Set::getReg(this_03);
                    std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_350,psVar4);
                    local_338 = 1;
                    paVar1 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                             ((long)&p_8.
                                     super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi + 7);
                    local_340 = &local_350;
                    std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(paVar1);
                    __l_01._M_len = local_338;
                    __l_01._M_array = local_340;
                    std::
                    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ::vector(__return_storage_ptr__,__l_01,paVar1);
                    std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                              ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                               ((long)&p_8.
                                       super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi + 7));
                    local_700 = (shared_ptr<mocker::nasm::Register> *)&local_340;
                    do {
                      local_700 = local_700 + -1;
                      std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_700);
                    } while (local_700 != &local_350);
                    p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._0_4_ = 1;
                  }
                  else {
                    p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._0_4_ = 0;
                  }
                  std::shared_ptr<mocker::nasm::Set>::~shared_ptr
                            ((shared_ptr<mocker::nasm::Set> *)local_330);
                  if ((int)p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi == 0) {
                    dyc<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Inst>const&>
                              ((shared_ptr<mocker::nasm::Inst> *)local_370);
                    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_370);
                    if (bVar3) {
                      psVar4 = rax();
                      std::shared_ptr<mocker::nasm::Register>::shared_ptr
                                ((shared_ptr<mocker::nasm::Register> *)local_3a0,psVar4);
                      psVar4 = rdx();
                      std::shared_ptr<mocker::nasm::Register>::shared_ptr
                                ((shared_ptr<mocker::nasm::Register> *)(local_3a0 + 0x10),psVar4);
                      local_380.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           = (element_type *)local_3a0;
                      local_380.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
                      paVar1 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                               ((long)&p_9.
                                       super___shared_ptr<mocker::nasm::Cqo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi + 7);
                      std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(paVar1);
                      __l_00._M_len =
                           (size_type)
                           local_380.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
                      __l_00._M_array =
                           (iterator)
                           local_380.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::vector(__return_storage_ptr__,__l_00,paVar1);
                      std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                                ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                                 ((long)&p_9.
                                         super___shared_ptr<mocker::nasm::Cqo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi + 7));
                      local_760 = &local_380;
                      do {
                        local_760 = local_760 + -1;
                        std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_760);
                      } while (local_760 != (shared_ptr<mocker::nasm::Register> *)local_3a0);
                      p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._0_4_ = 1;
                    }
                    else {
                      p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._0_4_ = 0;
                    }
                    std::shared_ptr<mocker::nasm::IDiv>::~shared_ptr
                              ((shared_ptr<mocker::nasm::IDiv> *)local_370);
                    if ((int)p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi == 0) {
                      dyc<mocker::nasm::Cqo,std::shared_ptr<mocker::nasm::Inst>const&>
                                ((shared_ptr<mocker::nasm::Inst> *)local_3c0);
                      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_3c0);
                      if (bVar3) {
                        local_3e8 = (undefined1 *)&local_3e0;
                        psVar4 = rdx();
                        std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_3e0,psVar4);
                        local_3c8 = 1;
                        local_3d0 = &local_3e0;
                        std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator
                                  (&local_3e9);
                        __l._M_len = local_3c8;
                        __l._M_array = local_3d0;
                        std::
                        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ::vector(__return_storage_ptr__,__l,&local_3e9);
                        std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                                  (&local_3e9);
                        local_7b8 = (shared_ptr<mocker::nasm::Register> *)&local_3d0;
                        do {
                          local_7b8 = local_7b8 + -1;
                          std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_7b8);
                        } while (local_7b8 != &local_3e0);
                        p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_ = 1;
                      }
                      else {
                        p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_ = 0;
                      }
                      std::shared_ptr<mocker::nasm::Cqo>::~shared_ptr
                                ((shared_ptr<mocker::nasm::Cqo> *)local_3c0);
                      if ((int)p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi == 0) {
                        __assert_fail("false",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                                      ,0x83,
                                      "std::vector<std::shared_ptr<Register>> mocker::nasm::getDefinedRegs(const std::shared_ptr<Inst> &)"
                                     );
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<Register>>
getDefinedRegs(const std::shared_ptr<Inst> &inst) {
  if (dyc<Empty>(inst) || dyc<Ret>(inst) || dyc<Push>(inst) || dyc<Jmp>(inst) ||
      dyc<CJump>(inst) || dyc<Cmp>(inst)) {
    return {};
  }
  if (auto p = dyc<Mov>(inst)) {
    if (auto reg = dyc<nasm::Register>(p->getDest()))
      return {reg};
    return {};
  }
  if (auto p = dyc<Lea>(inst)) {
    return {p->getDest()};
  }
  if (auto p = dyc<UnaryInst>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<BinaryInst>(inst)) {
    return {dyc<Register>(p->getLhs())};
  }
  if (auto p = dyc<Call>(inst)) {
    return {rax(), rcx(), rdx(), rsp(), rsi(), rdi(), r8(), r9(), r10(), r11()};
  }
  if (auto p = dyc<Pop>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<Leave>(inst)) {
    return {rsp(), rbp()};
  }
  if (auto p = dyc<Set>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<IDiv>(inst)) {
    return {rax(), rdx()};
  }
  if (auto p = dyc<Cqo>(inst)) {
    return {rdx()};
  }
  assert(false);
}